

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorShader.cpp
# Opt level: O2

Pool<Rml::ShaderElementData> * Rml::GetShaderElementDataPool(void)

{
  int iVar1;
  
  if (GetShaderElementDataPool()::gradient_element_data_pool == '\0') {
    iVar1 = __cxa_guard_acquire(&GetShaderElementDataPool()::gradient_element_data_pool);
    if (iVar1 != 0) {
      Pool<Rml::ShaderElementData>::Pool
                (&GetShaderElementDataPool::gradient_element_data_pool,0x14,true);
      __cxa_atexit(Pool<Rml::ShaderElementData>::~Pool,
                   &GetShaderElementDataPool::gradient_element_data_pool,&__dso_handle);
      __cxa_guard_release(&GetShaderElementDataPool()::gradient_element_data_pool);
    }
  }
  return &GetShaderElementDataPool::gradient_element_data_pool;
}

Assistant:

Pool<ShaderElementData>& GetShaderElementDataPool()
{
	static Pool<ShaderElementData> gradient_element_data_pool(20, true);
	return gradient_element_data_pool;
}